

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

double binomialCoefficient(double n,double k)

{
  double *pdVar1;
  double local_40;
  double i;
  double c;
  double _k;
  double k_local;
  double n_local;
  
  if ((k < 0.0) || (n < k)) {
    n_local = 0.0;
  }
  else if (((k == 0.0) && (!NAN(k))) || ((k == n && (!NAN(k) && !NAN(n))))) {
    n_local = 1.0;
  }
  else {
    c = n - k;
    _k = k;
    k_local = n;
    pdVar1 = std::min<double>(&_k,&c);
    i = 1.0;
    for (local_40 = 0.0; local_40 < *pdVar1; local_40 = local_40 + 1.0) {
      i = ((k_local - local_40) / (local_40 + 1.0)) * i;
    }
    n_local = i;
  }
  return n_local;
}

Assistant:

double binomialCoefficient(const double n, const double k) {
    if (k < 0 || k > n) {
        return 0;
    }
    if (k == 0 || k == n) {
        return 1;
    }
    double _k = std::min(k, n - k); //# take advantage of symmetry
    double c = 1;
    for (double i = 0; i < _k; ++i) {
        c *= (n - i) / (i + 1);
    }
    return c;
}